

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.h
# Opt level: O0

void __thiscall
hedg::Client<hedg::Rest_Client>::
send_request<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Back>>
          (Client<hedg::Rest_Client> *this,
          _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Back>
          *f,place_order<hedg::Back> *p)

{
  place_order<hedg::Back> *f_00;
  place_order<hedg::Back> local_88;
  place_order<hedg::Back> *local_20;
  place_order<hedg::Back> *p_local;
  _func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Back>
  *f_local;
  Client<hedg::Rest_Client> *this_local;
  
  local_20 = p;
  p_local = (place_order<hedg::Back> *)f;
  f_local = (_func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Back>
             *)this;
  if ((this->is_connected & 1U) == 0) {
    boost::asio::ssl::
    stream<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>
    ::handshake(&this->sock_,client);
    this->is_connected = true;
  }
  f_00 = p_local;
  params::place_order<hedg::Back>::place_order(&local_88,p);
  Rest_Client::
  send<boost::beast::http::message<true,boost::beast::http::basic_string_body<char,std::char_traits<char>,std::allocator<char>>,boost::beast::http::basic_fields<std::allocator<char>>>,hedg::params::place_order<hedg::Back>>
            ((Rest_Client *)this,
             (_func_void_message<true,_boost::beast::http::basic_string_body<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_ptr_place_order<hedg::Back>
              *)f_00,&local_88);
  params::place_order<hedg::Back>::~place_order(&local_88);
  return;
}

Assistant:

void send_request(void (*f) (Buff&, T), T p) {

		if (!is_connected) {
			sock_.handshake(ssl_socket::client);
			is_connected = true;
		}
		static_cast<Derived*>(this)->send(f, p);
	}